

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O0

void __thiscall
dynet::RMSPropTrainer::update_lookup_params(RMSPropTrainer *this,real gscale,size_t idx,size_t lidx)

{
  initializer_list<dynet::Tensor_*> __l;
  vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_> *this_00
  ;
  reference __a;
  reference this_01;
  reference pvVar1;
  reference pvVar2;
  size_type in_RDX;
  size_type in_RSI;
  long *in_RDI;
  undefined4 in_XMM0_Da;
  value_type *p;
  vector<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_> *in_stack_ffffffffffffff80;
  undefined1 *puVar3;
  undefined1 local_40 [24];
  const_reference local_28;
  size_type local_20;
  size_type local_18;
  undefined4 local_c;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_c = in_XMM0_Da;
  this_00 = ParameterCollection::lookup_parameters_list((ParameterCollection *)0xdb38eb);
  local_28 = std::
             vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>
             ::operator[](this_00,local_18);
  __a = std::vector<dynet::Tensor,_std::allocator<dynet::Tensor>_>::operator[]
                  (&(*local_28)->values,local_20);
  this_01 = std::vector<dynet::Tensor,_std::allocator<dynet::Tensor>_>::operator[]
                      (&(*local_28)->grads,local_20);
  pvVar1 = std::
           vector<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>::
           operator[]((vector<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>
                       *)(in_RDI + 10),local_18);
  pvVar2 = std::vector<dynet::Tensor,_std::allocator<dynet::Tensor>_>::operator[]
                     (&pvVar1->h,local_20);
  puVar3 = &stack0xffffffffffffff98;
  std::allocator<dynet::Tensor_*>::allocator((allocator<dynet::Tensor_*> *)0xdb3999);
  __l._M_len = (size_type)puVar3;
  __l._M_array = (iterator)pvVar2;
  std::vector<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_>::vector
            ((vector<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_> *)this_01,__l,
             (allocator_type *)__a);
  (**(code **)(*in_RDI + 0x28))(local_c,in_RDI,local_40);
  std::vector<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_>::~vector(in_stack_ffffffffffffff80)
  ;
  std::allocator<dynet::Tensor_*>::~allocator((allocator<dynet::Tensor_*> *)0xdb39e3);
  return;
}

Assistant:

void RMSPropTrainer::update_lookup_params(real gscale, size_t idx, size_t lidx) {
  auto & p = model->lookup_parameters_list()[idx];
  update_rule(gscale, {&p->values[lidx], &p->grads[lidx], &hlmsg[idx].h[lidx]});
}